

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::Tracer_testPropagation_Test::TestBody(Tracer_testPropagation_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte bVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  bool bVar3;
  undefined8 uVar4;
  long *plVar5;
  char cVar6;
  int iVar7;
  undefined8 uVar8;
  SpanContext *pSVar9;
  iterator iVar10;
  long *plVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  undefined8 uVar14;
  long lVar15;
  long lVar16;
  long *plVar17;
  size_type *psVar18;
  value_type *pvVar19;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  AssertionResult *this_02;
  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
  *peVar20;
  __buckets_ptr pp_Var21;
  char *pcVar22;
  pointer __old_p;
  pointer __old_p_2;
  ReaderMock<opentracing::v3::TextMapReader> textReader;
  _func_int *local_560 [2];
  FakeSpanContext fakeCtx;
  undefined1 local_540 [40];
  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
  result_2;
  AssertionResult gtest_ar__1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  float local_4e0;
  size_t local_4d8;
  __node_base_ptr p_Stack_4d0;
  AssertionResult gtest_ar__5;
  undefined1 local_4b8 [16];
  expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
  result;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_468;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_428;
  undefined1 local_3e8 [5];
  undefined1 local_3e3;
  undefined1 local_3e2;
  undefined1 local_3e1;
  WriterMock<opentracing::v3::HTTPHeadersWriter> headerWriter;
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  float local_3b0;
  size_t local_3a8;
  __node_base_ptr ap_Stack_3a0 [20];
  char *local_300;
  uint64_t local_2f8;
  uint64_t local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  char *local_2e0;
  ReaderMock<opentracing::v3::HTTPHeadersReader> headerReader;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  stringstream ss;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_2b0;
  void *local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
  avStack_290 [3];
  ios_base local_248 [16];
  ios_base local_238 [264];
  undefined1 local_130 [24];
  undefined1 local_118 [24];
  SpanContext local_100;
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  sVar2.ptr_ = sStack_2b0.ptr_;
  plVar5 = (long *)_ss;
  if (sStack_2b0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(sStack_2b0.ptr_)->_M_string_length = (int)(sStack_2b0.ptr_)->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&(sStack_2b0.ptr_)->_M_string_length = (int)(sStack_2b0.ptr_)->_M_string_length + 1;
    }
  }
  if (sStack_2b0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_2b0.ptr_);
  }
  avStack_290[0].
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_290[0].
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298 = 0;
  avStack_290[0].
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8 = (void *)0x0;
  uStack_2a0 = 0;
  _ss = (void **)0x0;
  sStack_2b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (**(code **)(*plVar5 + 0x10))(&gtest_ar,plVar5,"test-inject",0xb,&ss);
  uVar4 = gtest_ar._0_8_;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
  ::~vector(avStack_290);
  if (local_2a8 != (void *)0x0) {
    operator_delete(local_2a8);
  }
  (**(code **)(*(long *)uVar4 + 0x28))
            (uVar4,"test-baggage-item-key",0x15,"test baggage item value",0x17);
  local_2e8 = sVar2.ptr_;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  uVar8 = (**(code **)(*(long *)uVar4 + 0x50))(uVar4);
  (**(code **)(*plVar5 + 0x18))(&gtest_ar,plVar5,uVar8,&local_2a8);
  result.has_value_ = gtest_ar.success_;
  result.contained.m_value._M_t.
  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
  ._M_t.
  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
  .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
       (value_type)
       (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
        )0x0;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&result.has_value_,"static_cast<bool>(tracer->Inject(span->context(), ss))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&fakeCtx,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
               ,0x15d,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&fakeCtx,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fakeCtx);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)gtest_ar._0_8_ != &local_3c0) {
      operator_delete((void *)gtest_ar._0_8_);
    }
    if (gtest_ar__1._0_8_ != 0) {
      cVar6 = testing::internal::IsTrue(true);
      if ((cVar6 != '\0') && (gtest_ar__1._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
      }
      gtest_ar__1.success_ = false;
      gtest_ar__1._1_7_ = 0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&result.contained.m_value,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&result.contained.m_value,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    (**(code **)(*plVar5 + 0x38))(&result,plVar5,&ss);
    gtest_ar__1.success_ = result.has_value_;
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (result.has_value_ == false) {
      testing::Message::Message((Message *)&fakeCtx);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&gtest_ar,&gtest_ar__1.success_,"static_cast<bool>(result)","false");
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&textReader,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                 ,0x15f,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&textReader,(Message *)&fakeCtx);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)gtest_ar._0_8_ != &local_3c0) {
        operator_delete((void *)gtest_ar._0_8_);
      }
      if (fakeCtx.super_SpanContext._vptr_SpanContext != (_func_int **)0x0) {
        cVar6 = testing::internal::IsTrue(true);
        if ((cVar6 != '\0') && (fakeCtx.super_SpanContext._vptr_SpanContext != (_func_int **)0x0)) {
          (**(code **)(*(long *)fakeCtx.super_SpanContext._vptr_SpanContext + 8))();
        }
        fakeCtx.super_SpanContext._vptr_SpanContext = (SpanContext)(_func_int **)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar__1.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (result.has_value_ != false) {
        if (result.contained.m_value._M_t.
            super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
            ._M_t.
            super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
            .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl !=
            (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)result.contained.m_value._M_t.
                                super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                _M_head_impl + 8))();
        }
        result.contained.m_value._M_t.
        super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
        ._M_t.
        super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
        .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
             (value_type)
             (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
              )0x0;
      }
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar__1.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar8 = result.contained.m_value._M_t.
              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
              ._M_t.
              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl;
      if (result.has_value_ == false) goto LAB_0019fcc8;
      result.contained.m_value._M_t.
      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
      ._M_t.
      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
           (value_type)
           (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
            )0x0;
      this_00 = &gtest_ar__1.message_;
      gtest_ar__1.success_ =
           (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
            )uVar8 !=
           (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
            )0x0;
      gtest_ar__1.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
           )uVar8 ==
          (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
          )0x0) {
        testing::Message::Message((Message *)&fakeCtx);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&gtest_ar,&gtest_ar__1.success_,"static_cast<bool>(extractedCtx)","false");
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&textReader,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                   ,0x162,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&textReader,(Message *)&fakeCtx);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)gtest_ar._0_8_ != &local_3c0) {
          operator_delete((void *)gtest_ar._0_8_);
        }
        if (fakeCtx.super_SpanContext._vptr_SpanContext != (_func_int **)0x0) {
          cVar6 = testing::internal::IsTrue(true);
          if ((cVar6 != '\0') && (fakeCtx.super_SpanContext._vptr_SpanContext != (_func_int **)0x0))
          {
            (**(code **)(*(long *)fakeCtx.super_SpanContext._vptr_SpanContext + 8))();
          }
          fakeCtx.super_SpanContext._vptr_SpanContext = (SpanContext)(_func_int **)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pSVar9 = (SpanContext *)(**(code **)(*(long *)uVar4 + 0x50))(uVar4);
        testing::internal::CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
                  ((internal *)&gtest_ar,"span->context()","*extractedCtx",pSVar9,
                   (SpanContext *)uVar8);
        if (gtest_ar.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&gtest_ar.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          fakeCtx.super_SpanContext._vptr_SpanContext = (SpanContext)&PTR__SpanContext_00228628;
          std::ios::clear((int)&ss + (int)_ss[-3]);
          gtest_ar._0_8_ = &local_3c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar,"");
          std::__cxx11::stringbuf::str((string *)&uStack_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)gtest_ar._0_8_ != &local_3c0) {
            operator_delete((void *)gtest_ar._0_8_);
          }
          (**(code **)(*plVar5 + 0x18))(&gtest_ar,plVar5,&fakeCtx,&local_2a8);
          bVar3 = gtest_ar.success_;
          pvVar19 = (value_type *)CONCAT71((int7)((ulong)this_00 >> 8),gtest_ar.success_);
          gtest_ar__1._0_8_ = CONCAT71(gtest_ar__1._1_7_,gtest_ar.success_) ^ 1;
          gtest_ar__1.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (gtest_ar.success_ == false) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar__1.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::Message::Message((Message *)&textReader);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&gtest_ar,&gtest_ar__1.success_,
                       "static_cast<bool>(tracer->Inject(fakeCtx, ss))","true");
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__5,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                       ,0x167,(char *)gtest_ar._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__5,(Message *)&textReader);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)gtest_ar._0_8_ != &local_3c0) {
              operator_delete((void *)gtest_ar._0_8_);
            }
            if (textReader.super_TextMapReader._vptr_TextMapReader != (_func_int **)0x0) {
              cVar6 = testing::internal::IsTrue(true);
              if ((cVar6 != '\0') &&
                 (textReader.super_TextMapReader._vptr_TextMapReader != (_func_int **)0x0)) {
                (**(code **)(*textReader.super_TextMapReader._vptr_TextMapReader + 8))();
              }
              textReader.super_TextMapReader._vptr_TextMapReader = (_func_int **)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar__1.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          (**(code **)(*(long *)uVar8 + 8))(uVar8);
          if (result.has_value_ == true) {
            if (result.contained.m_value._M_t.
                super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                ._M_t.
                super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl !=
                (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                 )0x0) {
              (**(code **)(*(long *)result.contained.m_value._M_t.
                                    super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                    .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                    _M_head_impl + 8))();
            }
            result.contained.m_value._M_t.
            super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
            ._M_t.
            super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
            .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                 (value_type)
                 (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                  )0x0;
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(local_238);
          if (bVar3 != false) goto LAB_0019e249;
          gtest_ar._0_8_ = ap_Stack_3a0;
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
          local_3c0._M_allocated_capacity = 0;
          local_3c0._8_8_ = 0;
          local_3b0 = 1.0;
          local_3a8 = 0;
          ap_Stack_3a0[0] = (__node_base_ptr)0x0;
          fakeCtx.super_SpanContext._vptr_SpanContext = (SpanContext)&PTR__TextMapWriter_00228708;
          uVar8 = (**(code **)(*(long *)uVar4 + 0x50))(uVar4);
          (**(code **)(*plVar5 + 0x20))(&ss,plVar5,uVar8,&fakeCtx);
          result.has_value_ = (bool)ss;
          result.contained.m_value._M_t.
          super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
          ._M_t.
          super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
          .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
               (value_type)
               (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                )0x0;
          if (ss == (stringstream)0x0) {
            testing::Message::Message((Message *)&gtest_ar__1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((AssertionResult *)&ss,&result.has_value_,
                       "static_cast<bool>(tracer->Inject(span->context(), textWriter))","false");
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&textReader,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                       ,0x16f,(char *)_ss);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&textReader,(Message *)&gtest_ar__1);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
            if (_ss != &local_2a8) {
              operator_delete(_ss);
            }
            if (gtest_ar__1._0_8_ != 0) {
              cVar6 = testing::internal::IsTrue(true);
              if ((cVar6 != '\0') && (gtest_ar__1._0_8_ != 0)) {
                (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
              }
              gtest_ar__1.success_ = false;
              gtest_ar__1._1_7_ = 0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&result.contained.m_value,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_0019e7d4:
            this_01 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&gtest_ar;
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&result.contained.m_value,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            gtest_ar__1._0_4_ = 2;
            result._0_8_ = local_3c0._8_8_;
            testing::internal::CmpHelperEQ<int,unsigned_long>
                      ((internal *)&ss,"2","textMap.size()",(int *)&gtest_ar__1,
                       (unsigned_long *)&result);
            if (ss == (stringstream)0x0) {
              testing::Message::Message((Message *)&result);
              pcVar22 = "";
              if (sStack_2b0.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar22 = ((sStack_2b0.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__1,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                         ,0x170,pcVar22);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__1,(Message *)&result);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
              if (result._0_8_ != 0) {
                cVar6 = testing::internal::IsTrue(true);
                if ((cVar6 != '\0') && (result._0_8_ != 0)) {
                  (**(code **)(*(long *)result._0_8_ + 8))();
                }
                result.has_value_ = false;
                result._1_7_ = 0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&sStack_2b0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              goto LAB_0019e7d4;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&sStack_2b0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
            pSVar9 = (SpanContext *)(**(code **)(*(long *)uVar4 + 0x50))(uVar4);
            SpanContext::print<std::ostream>
                      (pSVar9,(basic_ostream<char,_std::char_traits<char>_> *)&ss);
            std::__cxx11::stringbuf::str();
            uVar8 = &local_4f0;
            gtest_ar__1._0_8_ = uVar8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&gtest_ar__1,"uber-trace-id","");
            iVar10 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)&gtest_ar,(key_type *)&gtest_ar__1);
            if (iVar10.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
LAB_0019ffa6:
              testing::Message::Message((Message *)&textReader);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)&result,(char *)&fakeCtx,
                         "static_cast<bool>(extractedCtx)","false");
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__5,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                         ,0x1cc,(char *)result._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__5,(Message *)&textReader);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5);
              if ((value_type *)result._0_8_ != pvVar19) {
                operator_delete((void *)result._0_8_);
              }
LAB_0019fe35:
              testing::Message::~Message((Message *)&textReader);
              peVar20 = (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                         *)&fakeCtx;
LAB_0019fe93:
              testing::AssertionResult::~AssertionResult((AssertionResult *)peVar20);
              cVar6 = '\0';
              __old_p_2 = (pointer)uVar8;
LAB_0019fe9e:
              SpanContext::~SpanContext((SpanContext *)&gtest_ar);
LAB_0019fac4:
              if ((__uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                   )__old_p_2 !=
                  (__uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                   )0x0) {
                (**(code **)(*(long *)__old_p_2 + 8))(__old_p_2);
              }
              if (result_2.has_value_ == true) {
                if (result_2.contained.m_value._M_t.
                    super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                    .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl !=
                    (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                     )0x0) {
                  (**(code **)(*(long *)result_2.contained.m_value._M_t.
                                        super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                        .
                                        super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                        ._M_head_impl + 8))();
                }
                result_2.contained.m_value._M_t.
                super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                ._M_t.
                super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                     (value_type)
                     (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                      )0x0;
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
              std::ios_base::~ios_base(local_248);
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)&gtest_ar__1);
              if (cVar6 != '\0') {
                (**(code **)(*plVar5 + 0x58))(plVar5);
              }
              goto LAB_0019e249;
            }
            testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                      ((internal *)&textReader,"oss.str()","textMap.at(kTraceContextHeaderName)",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)iVar10.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              ._M_cur + 0x28));
            if (gtest_ar__1._0_8_ != uVar8) {
              operator_delete((void *)gtest_ar__1._0_8_);
            }
            pvVar19 = &result.contained.m_value + 1;
            if ((value_type *)result._0_8_ != pvVar19) {
              operator_delete((void *)result._0_8_);
            }
            if ((char)textReader.super_TextMapReader._vptr_TextMapReader == '\0') {
              testing::Message::Message((Message *)&result);
              if (textReader._keyValuePairs == (StrMap *)0x0) {
                pp_Var21 = (__buckets_ptr)0x1fd4e1;
              }
              else {
                pp_Var21 = ((textReader._keyValuePairs)->_M_h)._M_buckets;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__1,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                         ,0x173,(char *)pp_Var21);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__1,(Message *)&result);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
              if (result._0_8_ != 0) {
                cVar6 = testing::internal::IsTrue(true);
                if ((cVar6 != '\0') && (result._0_8_ != 0)) {
                  (**(code **)(*(long *)result._0_8_ + 8))();
                }
                result.has_value_ = false;
                result._1_7_ = 0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&textReader._keyValuePairs,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              goto LAB_0019e7b3;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&textReader._keyValuePairs,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            gtest_ar__1._0_8_ = uVar8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar__1,"uberctx-","");
            plVar11 = (long *)std::__cxx11::string::append(&gtest_ar__1.success_);
            plVar17 = plVar11 + 2;
            if ((long *)*plVar11 == plVar17) {
              result.contained.m_error._M_cat = (error_category *)*plVar17;
              result._0_8_ = pvVar19;
            }
            else {
              result.contained.m_error._M_cat = (error_category *)*plVar17;
              result._0_8_ = (long *)*plVar11;
            }
            result.contained.m_value._M_t.
            super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
            ._M_t.
            super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
            .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                 (value_type)
                 ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                   *)(plVar11 + 1))->
                 super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
            ;
            *plVar11 = (long)plVar17;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            iVar10 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)&gtest_ar,(key_type *)&result);
            if (iVar10.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
LAB_001a003f:
              testing::Message::Message((Message *)&fakeCtx);
              if (result.contained.m_value._M_t.
                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                  .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl !=
                  (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                   )0x0) {
                local_2e0 = *(char **)result.contained.m_value._M_t.
                                      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                      _M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&textReader,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                         ,0x1cd,local_2e0);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&textReader,(Message *)&fakeCtx);
LAB_0019fe77:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
              testing::Message::~Message((Message *)&fakeCtx);
              peVar20 = &result;
              goto LAB_0019fe93;
            }
            testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
                      ((internal *)&textReader,"\"test baggage item value\"",
                       "textMap.at(std::string(kTraceBaggageHeaderPrefix) + \"test-baggage-item-key\")"
                       ,(char (*) [24])"test baggage item value",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)iVar10.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              ._M_cur + 0x28));
            if ((value_type *)result._0_8_ != pvVar19) {
              operator_delete((void *)result._0_8_);
            }
            if (gtest_ar__1._0_8_ != uVar8) {
              operator_delete((void *)gtest_ar__1._0_8_);
            }
            if ((char)textReader.super_TextMapReader._vptr_TextMapReader == '\0') {
              testing::Message::Message((Message *)&result);
              if (textReader._keyValuePairs == (StrMap *)0x0) {
                pp_Var21 = (__buckets_ptr)0x1fd4e1;
              }
              else {
                pp_Var21 = ((textReader._keyValuePairs)->_M_h)._M_buckets;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__1,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                         ,0x176,(char *)pp_Var21);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__1,(Message *)&result);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
              if (result._0_8_ != 0) {
                cVar6 = testing::internal::IsTrue(true);
                if ((cVar6 != '\0') && (result._0_8_ != 0)) {
                  (**(code **)(*(long *)result._0_8_ + 8))();
                }
                result.has_value_ = false;
                result._1_7_ = 0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&textReader._keyValuePairs,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_0019e7b3:
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
              std::ios_base::~ios_base(local_248);
              goto LAB_0019e7d4;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&textReader._keyValuePairs,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            textReader.super_TextMapReader._vptr_TextMapReader =
                 (_func_int **)&PTR__TextMapReader_00228748;
            textReader._keyValuePairs = (StrMap *)&gtest_ar;
            (**(code **)(*plVar5 + 0x40))(&gtest_ar__1);
            gtest_ar__5.success_ = gtest_ar__1.success_;
            gtest_ar__5.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (gtest_ar__1.success_ == false) {
              testing::Message::Message((Message *)&result_2);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)&result,&gtest_ar__5.success_,
                         "static_cast<bool>(result)","false");
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&headerWriter,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                         ,0x179,(char *)result._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&headerWriter,(Message *)&result_2);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&headerWriter);
              if ((value_type *)result._0_8_ != pvVar19) {
                operator_delete((void *)result._0_8_);
              }
              if (result_2._0_8_ != 0) {
                cVar6 = testing::internal::IsTrue(true);
                if ((cVar6 != '\0') && (result_2._0_8_ != 0)) {
                  (**(code **)(*(long *)result_2._0_8_ + 8))();
                }
                result_2.has_value_ = false;
                result_2._1_7_ = 0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&gtest_ar__5.message_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              if (gtest_ar__1.success_ != false) {
                if (gtest_ar__1.message_.ptr_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  (**(code **)(((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p + 8))();
                }
                gtest_ar__1.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              }
              goto LAB_0019e7b3;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&gtest_ar__5.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            sVar2 = gtest_ar__1.message_;
            if (gtest_ar__1.success_ == false) goto LAB_0019fcc8;
            gtest_ar__1.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            gtest_ar__5.success_ =
                 sVar2.ptr_ !=
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            gtest_ar__5.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (sVar2.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              testing::Message::Message((Message *)&result_2);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)&result,&gtest_ar__5.success_,
                         "static_cast<bool>(extractedCtx)","false");
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&headerWriter,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                         ,0x17c,(char *)result._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&headerWriter,(Message *)&result_2);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&headerWriter);
              if ((value_type *)result._0_8_ != pvVar19) {
                operator_delete((void *)result._0_8_);
              }
              testing::Message::~Message((Message *)&result_2);
              testing::AssertionResult::~AssertionResult(&gtest_ar__5);
              cVar6 = '\0';
            }
            else {
              testing::AssertionResult::~AssertionResult(&gtest_ar__5);
              pSVar9 = (SpanContext *)(**(code **)(*(long *)uVar4 + 0x50))(uVar4);
              testing::internal::CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
                        ((internal *)&result,"span->context()","*extractedCtx",pSVar9,
                         (SpanContext *)sVar2.ptr_);
              cVar6 = result.has_value_;
              if (result.has_value_ == false) {
                testing::Message::Message((Message *)&gtest_ar__5);
                if (result.contained.m_value._M_t.
                    super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                    .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl ==
                    (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                     )0x0) {
                  pcVar22 = "";
                }
                else {
                  pcVar22 = *(char **)result.contained.m_value._M_t.
                                      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                      _M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&result_2,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                           ,0x17d,pcVar22);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&result_2,(Message *)&gtest_ar__5);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result_2);
                testing::Message::~Message((Message *)&gtest_ar__5);
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&result.contained.m_value,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            }
            if (sVar2.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(((sVar2.ptr_)->_M_dataplus)._M_p + 8))(sVar2.ptr_);
            }
            if (gtest_ar__1.success_ == true) {
              if (gtest_ar__1.message_.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p + 8))();
              }
              gtest_ar__1.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
            std::ios_base::~ios_base(local_248);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&gtest_ar);
            if (cVar6 == '\0') goto LAB_0019e249;
            gtest_ar__1._0_8_ = &p_Stack_4d0;
            gtest_ar__1.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
            local_4f0._M_allocated_capacity = 0;
            local_4f0._8_8_ = 0;
            local_4e0 = 1.0;
            local_4d8 = 0;
            p_Stack_4d0 = (__node_base_ptr)0x0;
            headerWriter.super_HTTPHeadersWriter.super_TextMapWriter._vptr_TextMapWriter =
                 (TextMapWriter)&PTR__TextMapWriter_00228680;
            headerWriter._keyValuePairs = (StrMap *)&gtest_ar__1;
            uVar8 = (**(code **)(*(long *)uVar4 + 0x50))(uVar4);
            (**(code **)(*plVar5 + 0x28))(&ss,plVar5,uVar8,&headerWriter);
            gtest_ar.success_ = (bool)ss;
            gtest_ar.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (ss == (stringstream)0x0) {
              testing::Message::Message((Message *)&result);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((AssertionResult *)&ss,&gtest_ar.success_,
                         "static_cast<bool>(tracer->Inject(span->context(), headerWriter))","false")
              ;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&fakeCtx,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                         ,0x185,(char *)_ss);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&fakeCtx,(Message *)&result);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fakeCtx);
              if (_ss != &local_2a8) {
                operator_delete(_ss);
              }
              testing::Message::~Message((Message *)&result);
              this_02 = &gtest_ar;
LAB_0019ecb1:
              testing::AssertionResult::~AssertionResult(this_02);
            }
            else {
              testing::AssertionResult::~AssertionResult(&gtest_ar);
              result._0_4_ = 2;
              gtest_ar._0_8_ = local_4f0._8_8_;
              testing::internal::CmpHelperEQ<int,unsigned_long>
                        ((internal *)&ss,"2","headerMap.size()",(int *)&result,
                         (unsigned_long *)&gtest_ar);
              if (ss == (stringstream)0x0) {
                testing::Message::Message((Message *)&gtest_ar);
                if (sStack_2b0.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar22 = "";
                }
                else {
                  pcVar22 = ((sStack_2b0.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&result,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                           ,0x186,pcVar22);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&result,(Message *)&gtest_ar);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result);
                testing::Message::~Message((Message *)&gtest_ar);
                this_02 = (AssertionResult *)&ss;
                goto LAB_0019ecb1;
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)&ss);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
              pSVar9 = (SpanContext *)(**(code **)(*(long *)uVar4 + 0x50))(uVar4);
              SpanContext::print<std::ostream>
                        (pSVar9,(basic_ostream<char,_std::char_traits<char>_> *)&ss);
              std::__cxx11::stringbuf::str();
              result._0_8_ = pvVar19;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"uber-trace-id","");
              pmVar12 = std::
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&gtest_ar__1,(key_type *)&result);
              testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                        ((internal *)&fakeCtx,"oss.str()","headerMap.at(kTraceContextHeaderName)",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar,pmVar12);
              if ((value_type *)result._0_8_ != pvVar19) {
                operator_delete((void *)result._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)gtest_ar._0_8_ != &local_3c0) {
                operator_delete((void *)gtest_ar._0_8_);
              }
              if ((char)fakeCtx.super_SpanContext._vptr_SpanContext == '\0') {
                testing::Message::Message((Message *)&gtest_ar);
                pcVar22 = (char *)gtest_ar._0_8_;
                if (&stack0x00000000 == (undefined1 *)0x3d0) {
                  pcVar22 = "";
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&result,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                           ,0x189,pcVar22);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&result,(Message *)&gtest_ar);
LAB_0019f8c8:
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&result);
                testing::Message::~Message((Message *)&gtest_ar);
                testing::AssertionResult::~AssertionResult((AssertionResult *)&fakeCtx);
              }
              else {
                testing::AssertionResult::~AssertionResult((AssertionResult *)&fakeCtx);
                result._0_8_ = pvVar19;
                std::__cxx11::string::_M_construct<char_const*>((string *)&result,"uberctx-","");
                plVar11 = (long *)std::__cxx11::string::append(&result.has_value_);
                gtest_ar._0_8_ = &local_3c0;
                psVar18 = (size_type *)(plVar11 + 2);
                if ((size_type *)*plVar11 == psVar18) {
                  local_3c0._M_allocated_capacity = *psVar18;
                  local_3c0._8_8_ = plVar11[3];
                }
                else {
                  local_3c0._M_allocated_capacity = *psVar18;
                  gtest_ar._0_8_ = (size_type *)*plVar11;
                }
                gtest_ar.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar11[1]
                ;
                *plVar11 = (long)psVar18;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                pmVar12 = std::
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&gtest_ar__1,(key_type *)&gtest_ar);
                testing::internal::CmpHelperEQ<char[30],std::__cxx11::string>
                          ((internal *)&fakeCtx,"\"test%20baggage%20item%20value\"",
                           "headerMap.at(std::string(kTraceBaggageHeaderPrefix) + \"test-baggage-item-key\")"
                           ,(char (*) [30])"test%20baggage%20item%20value",pmVar12);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)gtest_ar._0_8_ != &local_3c0) {
                  operator_delete((void *)gtest_ar._0_8_);
                }
                if ((value_type *)result._0_8_ != pvVar19) {
                  operator_delete((void *)result._0_8_);
                }
                if ((char)fakeCtx.super_SpanContext._vptr_SpanContext == '\0') {
                  testing::Message::Message((Message *)&gtest_ar);
                  pcVar22 = (char *)gtest_ar._0_8_;
                  if (&stack0x00000000 == (undefined1 *)0x3d0) {
                    pcVar22 = "";
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&result,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                             ,0x18c,pcVar22);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&result,(Message *)&gtest_ar);
                  goto LAB_0019f8c8;
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)&fakeCtx);
                headerReader.super_HTTPHeadersReader.super_TextMapReader._vptr_TextMapReader =
                     (TextMapReader)&PTR__TextMapReader_002286c0;
                headerReader._keyValuePairs = (StrMap *)&gtest_ar__1;
                (**(code **)(*plVar5 + 0x48))(&result_2,plVar5);
                result.has_value_ = result_2.has_value_;
                result.contained.m_value._M_t.
                super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                ._M_t.
                super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                     (value_type)
                     (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                      )0x0;
                if (result_2.has_value_ != false) {
                  testing::AssertionResult::~AssertionResult((AssertionResult *)&result);
                  uVar8 = result_2.contained.m_value._M_t.
                          super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                          .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl
                  ;
                  if (result_2.has_value_ == false) goto LAB_0019fcc8;
                  result_2.contained.m_value._M_t.
                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                  .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                       (value_type)
                       (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                        )0x0;
                  result.has_value_ =
                       (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                        )uVar8 !=
                       (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                        )0x0;
                  result.contained.m_value._M_t.
                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                  .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                       (value_type)
                       (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                        )0x0;
                  if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                       )uVar8 ==
                      (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                       )0x0) {
                    testing::Message::Message((Message *)&fakeCtx);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&gtest_ar,&result.has_value_,"static_cast<bool>(extractedCtx)",
                               "false");
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&textReader,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                               ,0x192,(char *)gtest_ar._0_8_);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&textReader,(Message *)&fakeCtx);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)gtest_ar._0_8_ != &local_3c0) {
                      operator_delete((void *)gtest_ar._0_8_);
                    }
LAB_0019fa56:
                    testing::Message::~Message((Message *)&fakeCtx);
                    peVar20 = &result;
                  }
                  else {
                    testing::AssertionResult::~AssertionResult((AssertionResult *)&result);
                    pSVar9 = (SpanContext *)(**(code **)(*(long *)uVar4 + 0x50))(uVar4);
                    testing::internal::
                    CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
                              ((internal *)&gtest_ar,"span->context()","*extractedCtx",pSVar9,
                               (SpanContext *)uVar8);
                    if (gtest_ar.success_ != false) {
                      testing::AssertionResult::~AssertionResult(&gtest_ar);
                      std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)&gtest_ar__1);
                      gtest_ar._0_8_ = &local_3c0;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&gtest_ar,"jaeger-debug-id","");
                      pmVar13 = std::__detail::
                                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                              *)&gtest_ar__1,(key_type *)&gtest_ar);
                      std::__cxx11::string::operator=((string *)pmVar13,"yes");
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)gtest_ar._0_8_ != &local_3c0) {
                        operator_delete((void *)gtest_ar._0_8_);
                      }
                      uVar14 = (**(code **)(*(long *)uVar4 + 0x50))(uVar4);
                      (**(code **)(*plVar5 + 0x28))(local_118,plVar5,uVar14,&headerWriter);
                      (**(code **)(*plVar5 + 0x48))(&gtest_ar,plVar5,&headerReader);
                      opentracing::v3::
                      expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                      ::operator=(&result_2,
                                  (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                   *)&gtest_ar);
                      if (gtest_ar.success_ == true) {
                        if (gtest_ar.message_.ptr_ !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
                        }
                        gtest_ar.message_.ptr_ =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                      }
                      result.has_value_ = result_2.has_value_;
                      result.contained.m_value._M_t.
                      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                           (value_type)
                           (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                            )0x0;
                      if (result_2.has_value_ == false) {
                        testing::Message::Message((Message *)&fakeCtx);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (&gtest_ar,&result.has_value_,"static_cast<bool>(result)","false")
                        ;
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&textReader,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                   ,0x19a,(char *)gtest_ar._0_8_);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&textReader,(Message *)&fakeCtx);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)gtest_ar._0_8_ != &local_3c0) {
                          operator_delete((void *)gtest_ar._0_8_);
                        }
                        goto LAB_0019fa56;
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)&result);
                      __old_p_2 = (pointer)result_2.contained.m_value._M_t.
                                           super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                           .
                                           super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                           ._M_head_impl;
                      if (result_2.has_value_ == false) goto LAB_0019fcc8;
                      result_2.contained.m_value._M_t.
                      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                           (value_type)
                           (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                            )0x0;
                      (**(code **)(*(long *)uVar8 + 8))(uVar8);
                      result.has_value_ =
                           (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                            )__old_p_2 !=
                           (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                            )0x0;
                      result.contained.m_value._M_t.
                      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                           (value_type)
                           (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                            )0x0;
                      if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                           )__old_p_2 ==
                          (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                           )0x0) {
                        testing::Message::Message((Message *)&fakeCtx);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (&gtest_ar,&result.has_value_,"static_cast<bool>(extractedCtx)",
                                   "false");
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&textReader,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                   ,0x19c,(char *)gtest_ar._0_8_);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&textReader,(Message *)&fakeCtx);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)gtest_ar._0_8_ != &local_3c0) {
                          operator_delete((void *)gtest_ar._0_8_);
                        }
                        testing::Message::~Message((Message *)&fakeCtx);
                        peVar20 = &result;
                      }
                      else {
                        testing::AssertionResult::~AssertionResult((AssertionResult *)&result);
                        pSVar9 = (SpanContext *)(**(code **)(*(long *)uVar4 + 0x50))(uVar4);
                        testing::internal::
                        CmpHelperNE<jaegertracing::SpanContext,jaegertracing::SpanContext>
                                  ((internal *)&gtest_ar,"span->context()","*extractedCtx",pSVar9,
                                   __old_p_2);
                        if (gtest_ar.success_ != false) {
                          testing::AssertionResult::~AssertionResult(&gtest_ar);
                          lVar15 = (**(code **)(*(long *)uVar4 + 0x50))(uVar4);
                          lVar16 = (**(code **)(*(long *)uVar4 + 0x50))(uVar4);
                          local_2f0 = *(uint64_t *)(lVar16 + 0x18);
                          lVar16 = (**(code **)(*(long *)uVar4 + 0x50))(uVar4);
                          local_2f8 = *(uint64_t *)(lVar16 + 0x20);
                          lVar16 = (**(code **)(*(long *)uVar4 + 0x50))(uVar4);
                          bVar1 = *(byte *)(lVar16 + 0x28);
                          lVar16 = (**(code **)(*(long *)uVar4 + 0x50))(uVar4);
                          result._0_8_ = pvVar19;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&result,"yes","");
                          fakeCtx.super_SpanContext._vptr_SpanContext = (SpanContext)local_540;
                          local_300 = "";
                          std::__cxx11::string::_M_construct<char_const*>((string *)&fakeCtx,"");
                          SpanContext::SpanContext
                                    ((SpanContext *)&gtest_ar,(TraceID *)(lVar15 + 8),local_2f0,
                                     local_2f8,bVar1 | 2,(StrMap *)(lVar16 + 0x30),(string *)&result
                                     ,(string *)&fakeCtx);
                          if (fakeCtx.super_SpanContext._vptr_SpanContext != (SpanContext)local_540)
                          {
                            operator_delete((void *)fakeCtx.super_SpanContext._vptr_SpanContext);
                          }
                          if ((value_type *)result._0_8_ != pvVar19) {
                            operator_delete((void *)result._0_8_);
                          }
                          testing::internal::
                          CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
                                    ((internal *)&result,"ctx","*extractedCtx",
                                     (SpanContext *)&gtest_ar,__old_p_2);
                          if (result.has_value_ == false) {
                            testing::Message::Message((Message *)&fakeCtx);
                            if (result.contained.m_value._M_t.
                                super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                _M_head_impl !=
                                (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                 )0x0) {
                              local_300 = *(char **)result.contained.m_value._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  .
                                                  super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                                  ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&textReader,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                       ,0x1a6,local_300);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&textReader,(Message *)&fakeCtx);
LAB_0019fc48:
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&textReader);
                            testing::Message::~Message((Message *)&fakeCtx);
                            peVar20 = &result;
                          }
                          else {
                            testing::AssertionResult::~AssertionResult((AssertionResult *)&result);
                            std::
                            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                     *)&gtest_ar__1);
                            result._0_8_ = pvVar19;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&result,"uber-trace-id","");
                            pmVar13 = std::__detail::
                                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&gtest_ar__1,(key_type *)&result);
                            std::__cxx11::string::operator=((string *)pmVar13,"12345678");
                            if ((value_type *)result._0_8_ != pvVar19) {
                              operator_delete((void *)result._0_8_);
                            }
                            (**(code **)(*plVar5 + 0x48))(&result,plVar5,&headerReader);
                            opentracing::v3::
                            expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                            ::operator=(&result_2,&result);
                            if (result.has_value_ == true) {
                              if (result.contained.m_value._M_t.
                                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                  .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                  _M_head_impl !=
                                  (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                   )0x0) {
                                (**(code **)(*(long *)result.contained.m_value._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  .
                                                  super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                                  ._M_head_impl + 8))();
                              }
                              result.contained.m_value._M_t.
                              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                              _M_head_impl = (value_type)
                                             (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                              )0x0;
                            }
                            fakeCtx.super_SpanContext._vptr_SpanContext._0_1_ = result_2.has_value_;
                            if (result_2.has_value_ != false) {
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)&fakeCtx);
                              uVar8 = result_2.contained.m_value._M_t.
                                      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                      _M_head_impl;
                              if (result_2.has_value_ == false) {
LAB_0019fcc8:
                                __assert_fail("has_value()",
                                              "/root/.hunter/_Base/d45d77d/2285c03/3b7ee27/Install/include/opentracing/expected/expected.hpp"
                                              ,0x28f,
                                              "value_type *opentracing::expected<std::unique_ptr<opentracing::SpanContext>>::operator->() [T = std::unique_ptr<opentracing::SpanContext>, E = std::error_code]"
                                             );
                              }
                              result_2.contained.m_value._M_t.
                              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                              _M_head_impl = (value_type)
                                             (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                              )0x0;
                              (**(code **)(*(long *)__old_p_2 + 8))();
                              fakeCtx.super_SpanContext._vptr_SpanContext =
                                   (SpanContext)(SpanContext)uVar8;
                              textReader.super_TextMapReader._vptr_TextMapReader = (_func_int **)0x0
                              ;
                              testing::internal::
                              CmpHelperEQ<jaegertracing::SpanContext_const*,jaegertracing::SpanContext_const*>
                                        ((internal *)&result,"nullptr","extractedCtx.get()",
                                         (SpanContext **)&textReader,(SpanContext **)&fakeCtx);
                              if (result.has_value_ == false) {
                                testing::Message::Message((Message *)&fakeCtx);
                                if (result.contained.m_value._M_t.
                                    super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                    .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                    _M_head_impl ==
                                    (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                     )0x0) {
                                  pcVar22 = "";
                                }
                                else {
                                  pcVar22 = *(char **)result.contained.m_value._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  .
                                                  super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&textReader,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                           ,0x1ae,pcVar22);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&textReader,(Message *)&fakeCtx);
                                goto LAB_0019fe77;
                              }
                              testing::AssertionResult::~AssertionResult((AssertionResult *)&result)
                              ;
                              std::
                              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                       *)&gtest_ar__1);
                              (**(code **)(*plVar5 + 0x48))(&result,plVar5,&headerReader);
                              opentracing::v3::
                              expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                              ::operator=(&result_2,&result);
                              if (result.has_value_ == true) {
                                if (result.contained.m_value._M_t.
                                    super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                    .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                    _M_head_impl !=
                                    (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                     )0x0) {
                                  (**(code **)(*(long *)result.contained.m_value._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  .
                                                  super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                                result.contained.m_value._M_t.
                                super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                _M_head_impl = (value_type)
                                               (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                                )0x0;
                              }
                              fakeCtx.super_SpanContext._vptr_SpanContext._0_1_ =
                                   result_2.has_value_;
                              if (result_2.has_value_ == false) {
                                testing::Message::Message((Message *)&textReader);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((AssertionResult *)&result,(char *)&fakeCtx,
                                           "static_cast<bool>(result)","false");
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar__5,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                           ,0x1b3,(char *)result._0_8_);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar__5,(Message *)&textReader);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar__5);
                                if ((value_type *)result._0_8_ != pvVar19) {
                                  operator_delete((void *)result._0_8_);
                                }
                                goto LAB_0019fe35;
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)&fakeCtx);
                              uVar14 = result_2.contained.m_value._M_t.
                                       super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                       .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                       ._M_head_impl;
                              if (result_2.has_value_ == false) goto LAB_0019fcc8;
                              __old_p_2 = (pointer)result_2.contained.m_value._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  .
                                                  super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                                  ._M_head_impl;
                              result_2.contained.m_value._M_t.
                              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                              _M_head_impl = (value_type)
                                             (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                              )0x0;
                              if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                   )uVar8 !=
                                  (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                   )0x0) {
                                (**(code **)(*(long *)uVar8 + 8))(uVar8);
                              }
                              fakeCtx.super_SpanContext._vptr_SpanContext =
                                   (SpanContext)(SpanContext)uVar14;
                              textReader.super_TextMapReader._vptr_TextMapReader = (_func_int **)0x0
                              ;
                              testing::internal::
                              CmpHelperEQ<jaegertracing::SpanContext_const*,jaegertracing::SpanContext_const*>
                                        ((internal *)&result,"nullptr","extractedCtx.get()",
                                         (SpanContext **)&textReader,(SpanContext **)&fakeCtx);
                              if (result.has_value_ == false) {
                                testing::Message::Message((Message *)&fakeCtx);
                                if (result.contained.m_value._M_t.
                                    super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                    .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                    _M_head_impl ==
                                    (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                     )0x0) {
                                  pcVar22 = "";
                                }
                                else {
                                  pcVar22 = *(char **)result.contained.m_value._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  .
                                                  super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&textReader,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                           ,0x1b5,pcVar22);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&textReader,(Message *)&fakeCtx);
                                goto LAB_0019fc48;
                              }
                              testing::AssertionResult::~AssertionResult((AssertionResult *)&result)
                              ;
                              std::
                              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                       *)&gtest_ar__1);
                              lVar15 = (**(code **)(*(long *)uVar4 + 0x50))(uVar4);
                              lVar16 = (**(code **)(*(long *)uVar4 + 0x50))(uVar4);
                              local_2f0 = *(uint64_t *)(lVar16 + 0x18);
                              lVar16 = (**(code **)(*(long *)uVar4 + 0x50))(uVar4);
                              local_2f8 = *(uint64_t *)(lVar16 + 0x20);
                              lVar16 = (**(code **)(*(long *)uVar4 + 0x50))(uVar4);
                              local_300 = (char *)CONCAT71(local_300._1_7_,
                                                           *(undefined1 *)(lVar16 + 0x28));
                              std::
                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                                        ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&result,(char (*) [2])0x1ef4fa,(char (*) [2])0x1eebde);
                              std::
                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                                        (&local_468,(char (*) [2])0x1f9551,(char (*) [2])0x1fa9d0);
                              std::
                              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                                        (&local_428,(char (*) [2])0x1eda5a,(char (*) [2])0x1f0680);
                              std::
                              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                              ::
                              _Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                          *)&fakeCtx,&result,local_3e8,0,&local_3e1,&local_3e2,
                                         &local_3e3);
                              textReader.super_TextMapReader._vptr_TextMapReader = local_560;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&textReader,"");
                              gtest_ar__5._0_8_ = local_4b8;
                              local_2e0 = "";
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&gtest_ar__5,"");
                              SpanContext::SpanContext
                                        (&local_100,(TraceID *)(lVar15 + 8),local_2f0,local_2f8,
                                         (uchar)local_300,(StrMap *)&fakeCtx,(string *)&textReader,
                                         (string *)&gtest_ar__5);
                              SpanContext::swap((SpanContext *)&gtest_ar,&local_100);
                              SpanContext::~SpanContext(&local_100);
                              if ((undefined1 *)gtest_ar__5._0_8_ != local_4b8) {
                                operator_delete((void *)gtest_ar__5._0_8_);
                              }
                              if (textReader.super_TextMapReader._vptr_TextMapReader != local_560) {
                                operator_delete(textReader.super_TextMapReader._vptr_TextMapReader);
                              }
                              std::
                              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                             *)&fakeCtx);
                              lVar15 = 0x80;
                              do {
                                std::
                                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)(&result.has_value_ + lVar15));
                                lVar15 = lVar15 + -0x40;
                              } while (lVar15 != -0x40);
                              (**(code **)(*plVar5 + 0x28))
                                        (local_130,plVar5,&gtest_ar,&headerWriter);
                              if ((__node_type *)local_4f0._M_allocated_capacity !=
                                  (__node_type *)0x0) {
                                uVar8 = local_4f0._M_allocated_capacity;
                                do {
                                  std::__cxx11::string::substr((ulong)&result,uVar8 + 8);
                                  iVar7 = std::__cxx11::string::compare(&result.has_value_);
                                  if ((value_type *)result._0_8_ != pvVar19) {
                                    operator_delete((void *)result._0_8_);
                                  }
                                  if (iVar7 == 0) {
                                    uVar8 = std::
                                            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                            ::erase((
                                                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                                  *)&gtest_ar__1,(const_iterator)uVar8);
                                  }
                                  else {
                                    uVar8 = *(undefined8 *)uVar8;
                                  }
                                } while ((__node_type *)uVar8 != (__node_type *)0x0);
                              }
                              result._0_8_ = pvVar19;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&result,"jaeger-baggage","");
                              pmVar13 = std::__detail::
                                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&gtest_ar__1,(key_type *)&result);
                              std::__cxx11::string::operator=((string *)pmVar13,"a=x,b=y,c=z");
                              if ((value_type *)result._0_8_ != pvVar19) {
                                operator_delete((void *)result._0_8_);
                              }
                              (**(code **)(*plVar5 + 0x48))(&result,plVar5,&headerReader);
                              opentracing::v3::
                              expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                              ::operator=(&result_2,&result);
                              if (result.has_value_ == true) {
                                if (result.contained.m_value._M_t.
                                    super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                    .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                    _M_head_impl !=
                                    (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                     )0x0) {
                                  (**(code **)(*(long *)result.contained.m_value._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  .
                                                  super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                                  ._M_head_impl + 8))();
                                }
                                result.contained.m_value._M_t.
                                super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                _M_head_impl = (value_type)
                                               (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                                )0x0;
                              }
                              fakeCtx.super_SpanContext._vptr_SpanContext._0_1_ =
                                   result_2.has_value_;
                              if (result_2.has_value_ == false) {
                                testing::Message::Message((Message *)&textReader);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((AssertionResult *)&result,(char *)&fakeCtx,
                                           "static_cast<bool>(result)","false");
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar__5,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                           ,0x1ca,(char *)result._0_8_);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar__5,(Message *)&textReader);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar__5);
                                if ((value_type *)result._0_8_ != pvVar19) {
                                  operator_delete((void *)result._0_8_);
                                }
                                goto LAB_0019fd6f;
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)&fakeCtx);
                              uVar8 = result_2.contained.m_value._M_t.
                                      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                      _M_head_impl;
                              if (result_2.has_value_ == false) goto LAB_0019fcc8;
                              result_2.contained.m_value._M_t.
                              super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                              .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                              _M_head_impl = (value_type)
                                             (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                              )0x0;
                              if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                   )uVar14 !=
                                  (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                   )0x0) {
                                (**(code **)(*(long *)uVar14 + 8))();
                              }
                              fakeCtx.super_SpanContext._vptr_SpanContext._0_1_ =
                                   (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                    )uVar8 !=
                                   (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                    )0x0;
                              if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                   )uVar8 ==
                                  (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                   )0x0) goto LAB_0019ffa6;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)&fakeCtx);
                              textReader.super_TextMapReader._vptr_TextMapReader._0_4_ = 3;
                              fakeCtx.super_SpanContext._vptr_SpanContext =
                                   *(SpanContext *)(uVar8 + 0x48);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)&result,"3","extractedCtx->baggage().size()",
                                         (int *)&textReader,(unsigned_long *)&fakeCtx);
                              if (result.has_value_ == false) goto LAB_001a003f;
                              testing::AssertionResult::~AssertionResult((AssertionResult *)&result)
                              ;
                              testing::internal::
                              CmpHelperEQ<jaegertracing::SpanContext,jaegertracing::SpanContext>
                                        ((internal *)&result,"ctx","*extractedCtx",
                                         (SpanContext *)&gtest_ar,(SpanContext *)uVar8);
                              cVar6 = result.has_value_;
                              if (result.has_value_ == false) {
                                testing::Message::Message((Message *)&fakeCtx);
                                if (result.contained.m_value._M_t.
                                    super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                    .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                    _M_head_impl ==
                                    (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                                     )0x0) {
                                  pcVar22 = "";
                                }
                                else {
                                  pcVar22 = *(char **)result.contained.m_value._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                                  .
                                                  super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&textReader,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                           ,0x1ce,pcVar22);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&textReader,(Message *)&fakeCtx);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&textReader);
                                testing::Message::~Message((Message *)&fakeCtx);
                              }
                              testing::AssertionResult::~AssertionResult((AssertionResult *)&result)
                              ;
                              __old_p_2 = (pointer)uVar8;
                              goto LAB_0019fe9e;
                            }
                            testing::Message::Message((Message *)&textReader);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((AssertionResult *)&result,(char *)&fakeCtx,
                                       "static_cast<bool>(result)","false");
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar__5,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                       ,0x1ac,(char *)result._0_8_);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar__5,(Message *)&textReader);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar__5);
                            if ((value_type *)result._0_8_ != pvVar19) {
                              operator_delete((void *)result._0_8_);
                            }
LAB_0019fd6f:
                            testing::Message::~Message((Message *)&textReader);
                            peVar20 = (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                       *)&fakeCtx;
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)peVar20);
                          cVar6 = '\0';
                          goto LAB_0019fe9e;
                        }
                        testing::Message::Message((Message *)&result);
                        if (gtest_ar.message_.ptr_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar22 = "";
                        }
                        else {
                          pcVar22 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&fakeCtx,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                                   ,0x19d,pcVar22);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&fakeCtx,(Message *)&result);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fakeCtx);
                        testing::Message::~Message((Message *)&result);
                        peVar20 = (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                                   *)&gtest_ar;
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)peVar20);
                      cVar6 = '\0';
                      goto LAB_0019fac4;
                    }
                    testing::Message::Message((Message *)&result);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar22 = "";
                    }
                    else {
                      pcVar22 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&fakeCtx,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                               ,0x193,pcVar22);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&fakeCtx,(Message *)&result);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fakeCtx);
                    testing::Message::~Message((Message *)&result);
                    peVar20 = (expected<std::unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>,_std::error_code>
                               *)&gtest_ar;
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)peVar20);
                  cVar6 = '\0';
                  __old_p_2 = (pointer)uVar8;
                  goto LAB_0019fac4;
                }
                testing::Message::Message((Message *)&fakeCtx);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&gtest_ar,&result.has_value_,"static_cast<bool>(result)","false");
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&textReader,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                           ,399,(char *)gtest_ar._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&textReader,(Message *)&fakeCtx);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&textReader);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)gtest_ar._0_8_ != &local_3c0) {
                  operator_delete((void *)gtest_ar._0_8_);
                }
                testing::Message::~Message((Message *)&fakeCtx);
                testing::AssertionResult::~AssertionResult((AssertionResult *)&result);
                if (result_2.has_value_ != false) {
                  if (result_2.contained.m_value._M_t.
                      super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                      .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl !=
                      (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                       )0x0) {
                    (**(code **)(*(long *)result_2.contained.m_value._M_t.
                                          super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                          .
                                          super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>
                                          ._M_head_impl + 8))();
                  }
                  result_2.contained.m_value._M_t.
                  super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                  .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
                       (value_type)
                       (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
                        )0x0;
                }
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
              std::ios_base::~ios_base(local_248);
            }
            this_01 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&gtest_ar__1;
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(this_01);
          goto LAB_0019e249;
        }
        testing::Message::Message((Message *)&gtest_ar__1);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar22 = "";
        }
        else {
          pcVar22 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&fakeCtx,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jaegertracing[P]jaeger-client-cpp/src/jaegertracing/TracerTest.cpp"
                   ,0x163,pcVar22);
        testing::internal::AssertHelper::operator=((AssertHelper *)&fakeCtx,(Message *)&gtest_ar__1)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&fakeCtx);
        if (gtest_ar__1._0_8_ != 0) {
          cVar6 = testing::internal::IsTrue(true);
          if ((cVar6 != '\0') && (gtest_ar__1._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
          }
          gtest_ar__1.success_ = false;
          gtest_ar__1._1_7_ = 0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      if ((__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
           )uVar8 !=
          (tuple<opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
          )0x0) {
        (**(code **)(*(long *)uVar8 + 8))(uVar8);
      }
      if (result.has_value_ == true) {
        if (result.contained.m_value._M_t.
            super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
            ._M_t.
            super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
            .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl !=
            (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)result.contained.m_value._M_t.
                                super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
                                .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>.
                                _M_head_impl + 8))();
        }
        result.contained.m_value._M_t.
        super___uniq_ptr_impl<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
        ._M_t.
        super__Tuple_impl<0UL,_opentracing::v3::SpanContext_*,_std::default_delete<opentracing::v3::SpanContext>_>
        .super__Head_base<0UL,_opentracing::v3::SpanContext_*,_false>._M_head_impl =
             (value_type)
             (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
              )0x0;
      }
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_238);
LAB_0019e249:
  if (uVar4 != 0) {
    (**(code **)(*(long *)uVar4 + 8))(uVar4);
  }
  if (local_2e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8);
  }
  if (handle.
      super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (handle.
               super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(Tracer, testPropagation)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer =
        std::static_pointer_cast<Tracer>(opentracing::Tracer::Global());
    const std::unique_ptr<Span> span(static_cast<Span*>(
        tracer->StartSpanWithOptions("test-inject", {}).release()));
    span->SetBaggageItem("test-baggage-item-key", "test baggage item value");

    // Binary
    {
        std::stringstream ss;
        ASSERT_TRUE(static_cast<bool>(tracer->Inject(span->context(), ss)));
        auto result = tracer->Extract(ss);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);
        FakeSpanContext fakeCtx;
        ss.clear();
        ss.str("");
        ASSERT_FALSE(static_cast<bool>(tracer->Inject(fakeCtx, ss)));
    }

    // Text map
    {
        StrMap textMap;
        WriterMock<opentracing::TextMapWriter> textWriter(textMap);
        ASSERT_TRUE(
            static_cast<bool>(tracer->Inject(span->context(), textWriter)));
        ASSERT_EQ(2, textMap.size());
        std::ostringstream oss;
        oss << span->context();
        ASSERT_EQ(oss.str(), textMap.at(kTraceContextHeaderName));
        ASSERT_EQ("test baggage item value",
                  textMap.at(std::string(kTraceBaggageHeaderPrefix) +
                             "test-baggage-item-key"));
        ReaderMock<opentracing::TextMapReader> textReader(textMap);
        auto result = tracer->Extract(textReader);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);
    }

    // HTTP map
    {
        StrMap headerMap;
        WriterMock<opentracing::HTTPHeadersWriter> headerWriter(headerMap);
        ASSERT_TRUE(
            static_cast<bool>(tracer->Inject(span->context(), headerWriter)));
        ASSERT_EQ(2, headerMap.size());
        std::ostringstream oss;
        oss << span->context();
        ASSERT_EQ(oss.str(), headerMap.at(kTraceContextHeaderName));
        ASSERT_EQ("test%20baggage%20item%20value",
                  headerMap.at(std::string(kTraceBaggageHeaderPrefix) +
                               "test-baggage-item-key"));
        ReaderMock<opentracing::HTTPHeadersReader> headerReader(headerMap);
        auto result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        std::unique_ptr<const SpanContext> extractedCtx(
            static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(span->context(), *extractedCtx);

        // Test debug header.
        headerMap.clear();
        headerMap[kJaegerDebugHeader] = "yes";
        tracer->Inject(span->context(), headerWriter);
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_NE(span->context(), *extractedCtx);
        SpanContext ctx(
            span->context().traceID(),
            span->context().spanID(),
            span->context().parentID(),
            span->context().flags() |
                static_cast<unsigned char>(SpanContext::Flag::kDebug),
            span->context().baggage(),
            "yes");
        ASSERT_EQ(ctx, *extractedCtx);

        // Test bad trace context.
        headerMap.clear();
        headerMap[kTraceContextHeaderName] = "12345678";
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_EQ(nullptr, extractedCtx.get());

        // Test empty map.
        headerMap.clear();
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_EQ(nullptr, extractedCtx.get());

        // Test alternative baggage format.
        headerMap.clear();
        ctx = SpanContext(span->context().traceID(),
                          span->context().spanID(),
                          span->context().parentID(),
                          span->context().flags(),
                          { { "a", "x" }, { "b", "y" }, { "c", "z" } });
        tracer->Inject(ctx, headerWriter);
        for (auto itr = std::begin(headerMap); itr != std::end(headerMap);) {
            if (itr->first.substr(0, std::strlen(kTraceBaggageHeaderPrefix)) ==
                kTraceBaggageHeaderPrefix) {
                itr = headerMap.erase(itr);
            }
            else {
                ++itr;
            }
        }
        headerMap[kJaegerBaggageHeader] = "a=x,b=y,c=z";
        result = tracer->Extract(headerReader);
        ASSERT_TRUE(static_cast<bool>(result));
        extractedCtx.reset(static_cast<SpanContext*>(result->release()));
        ASSERT_TRUE(static_cast<bool>(extractedCtx));
        ASSERT_EQ(3, extractedCtx->baggage().size());
        ASSERT_EQ(ctx, *extractedCtx);
    }
    tracer->Close();
}